

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMI_ECC_CURVE_Unmarshal(TPMI_ECC_CURVE *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMI_ECC_CURVE *target_local;
  
  target_local._4_4_ = UINT16_Unmarshal(target,buffer,size);
  if (target_local._4_4_ == 0) {
    if ((*target - 2 < 2) || (*target == 0x10)) {
      target_local._4_4_ = 0;
    }
    else {
      target_local._4_4_ = 0xa6;
    }
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMI_ECC_CURVE_Unmarshal(TPMI_ECC_CURVE *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_ECC_CURVE_Unmarshal((TPM_ECC_CURVE *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
#if         ECC_BN_P256
        case TPM_ECC_BN_P256:
#endif // ECC_BN_P256
#if         ECC_BN_P638
        case TPM_ECC_BN_P638:
#endif // ECC_BN_P638
#if         ECC_NIST_P192
        case TPM_ECC_NIST_P192:
#endif // ECC_NIST_P192
#if         ECC_NIST_P224
        case TPM_ECC_NIST_P224:
#endif // ECC_NIST_P224
#if         ECC_NIST_P256
        case TPM_ECC_NIST_P256:
#endif // ECC_NIST_P256
#if         ECC_NIST_P384
        case TPM_ECC_NIST_P384:
#endif // ECC_NIST_P384
#if         ECC_NIST_P521
        case TPM_ECC_NIST_P521:
#endif // ECC_NIST_P521
#if         ECC_SM2_P256
        case TPM_ECC_SM2_P256:
#endif // ECC_SM2_P256
            break;
        default:
            return TPM_RC_CURVE;
    }
    return TPM_RC_SUCCESS;
}